

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_ref_idx(bitstream *str,h264_cabac_context *cabac,int idx,int which,int max,uint32_t *val)

{
  int iVar1;
  h264_macroblock *phVar2;
  h264_macroblock *phVar3;
  h264_macroblock *phVar4;
  bool local_7e;
  bool local_7d;
  int local_7c [2];
  int ctxIdx [3];
  int condTermFlagB;
  int condTermFlagA;
  int thrB;
  int thrA;
  h264_macroblock *mbB;
  h264_macroblock *mbA;
  h264_macroblock *mbT;
  int local_40;
  int idxB;
  int idxA;
  uint32_t tmp;
  uint32_t *val_local;
  int local_28;
  int max_local;
  int which_local;
  int idx_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  _idxA = val;
  val_local._4_4_ = max;
  local_28 = which;
  max_local = idx;
  _which_local = cabac;
  cabac_local = (h264_cabac_context *)str;
  if (max == 0) {
    str_local._4_4_ = vs_infer(str,val,0);
  }
  else if (cabac == (h264_cabac_context *)0x0) {
    if (max == 1) {
      idxB = 1 - *val;
      iVar1 = vs_u(str,val,1);
      if (iVar1 == 0) {
        *_idxA = 1 - idxB;
        str_local._4_4_ = 0;
      }
      else {
        str_local._4_4_ = 1;
      }
    }
    else {
      str_local._4_4_ = vs_ue(str,val);
    }
  }
  else {
    phVar2 = h264_mb_nb(cabac->slice,H264_MB_THIS,0);
    phVar3 = h264_mb_nb_b(_which_local->slice,H264_MB_A,H264_BLOCK_8X8,0,max_local,&local_40);
    phVar4 = h264_mb_nb_b(_which_local->slice,H264_MB_B,H264_BLOCK_8X8,0,max_local,
                          (int *)((long)&mbT + 4));
    local_7d = false;
    if (phVar2->mb_field_decoding_flag == 0) {
      local_7d = phVar3->mb_field_decoding_flag != 0;
    }
    local_7e = false;
    if (phVar2->mb_field_decoding_flag == 0) {
      local_7e = phVar4->mb_field_decoding_flag != 0;
    }
    ctxIdx[2] = (int)((uint)local_7d < phVar3->ref_idx[local_28][local_40]);
    ctxIdx[1] = (int)((uint)local_7e < phVar4->ref_idx[local_28][mbT._4_4_]);
    local_7c[0] = ctxIdx[2] + 0x36U + ctxIdx[1] * 2;
    local_7c[1] = 0x3a;
    ctxIdx[0] = 0x3b;
    str_local._4_4_ =
         h264_cabac_tu((bitstream *)cabac_local,_which_local,local_7c,3,0xffffffff,_idxA);
  }
  return str_local._4_4_;
}

Assistant:

int h264_ref_idx(struct bitstream *str, struct h264_cabac_context *cabac, int idx, int which, int max, uint32_t *val) {
	if (!max)
		return vs_infer(str, val, 0);
	if (!cabac) {
		if (max == 1) {
			uint32_t tmp = 1 - *val;
			if (vs_u(str, val, 1)) return 1;
			*val = 1 - tmp;
			return 0;
		} else {
			return vs_ue(str, val);
		}
	}
	int idxA, idxB;
	const struct h264_macroblock *mbT = h264_mb_nb(cabac->slice, H264_MB_THIS, 0);
	const struct h264_macroblock *mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_8X8, 0, idx, &idxA);
	const struct h264_macroblock *mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_8X8, 0, idx, &idxB);
	int thrA, thrB;
	thrA = (!mbT->mb_field_decoding_flag && mbA->mb_field_decoding_flag);
	thrB = (!mbT->mb_field_decoding_flag && mbB->mb_field_decoding_flag);
	int condTermFlagA = mbA->ref_idx[which][idxA] > thrA;
	int condTermFlagB = mbB->ref_idx[which][idxB] > thrB;
	int ctxIdx[3];
	ctxIdx[0] = H264_CABAC_CTXIDX_REF_IDX + condTermFlagA + 2 * condTermFlagB;
	ctxIdx[1] = H264_CABAC_CTXIDX_REF_IDX + 4;
	ctxIdx[2] = H264_CABAC_CTXIDX_REF_IDX + 5;
	return h264_cabac_tu(str, cabac, ctxIdx, 3, -1, val);
}